

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.c
# Opt level: O2

void layout_menu(gamewin *gw)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  wchar_t wVar5;
  wchar_t wVar6;
  long lVar7;
  char *pcVar8;
  size_t sVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  _func_void_gamewin_ptr *__s;
  ulong uVar14;
  wchar_t col;
  ulong uVar15;
  _func_void_gamewin_ptr *p_Var16;
  wchar_t local_9c;
  ulong local_98;
  wchar_t colwidth [16];
  
  iVar3 = *(int *)((long)&gw[4].resize + 4);
  if (iVar3 < 1) {
    iVar3 = 0;
  }
  iVar10 = 0;
  if (0 < *(int *)&gw[4].win) {
    iVar10 = *(int *)&gw[4].win;
  }
  iVar11 = *(int *)((long)&gw[4].win + 4);
  iVar2 = _COLS;
  if (iVar11 < _COLS) {
    iVar2 = iVar11;
  }
  if (iVar11 < 1) {
    iVar2 = _COLS;
  }
  iVar11 = *(int *)&gw[4].next;
  iVar4 = _LINES;
  if (iVar11 < _LINES) {
    iVar4 = iVar11;
  }
  if (iVar11 < 1) {
    iVar4 = _LINES;
  }
  *(undefined4 *)&gw[2].resize = 2;
  iVar11 = 2;
  if ((gw[1].next != (gamewin *)0x0) && (*(char *)&(gw[1].next)->draw != '\0')) {
    *(undefined4 *)&gw[2].resize = 4;
    iVar11 = 4;
  }
  uVar1 = *(uint *)&gw[1].prev;
  uVar12 = 0x34;
  if ((int)uVar1 < 0x34) {
    uVar12 = uVar1;
  }
  iVar13 = uVar12 + iVar11;
  if (iVar4 - iVar10 <= (int)(uVar12 + iVar11)) {
    iVar13 = iVar4 - iVar10;
  }
  *(int *)((long)&gw[2].draw + 4) = iVar13;
  *(int *)((long)&gw[2].resize + 4) = iVar13 - iVar11;
  *(undefined4 *)&gw[4].resize = 0;
  for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 1) {
    colwidth[lVar7] = L'\0';
  }
  local_98 = 0;
  if ((int)uVar1 < 1) {
    uVar1 = 0;
  }
  local_9c = L'\0';
  for (uVar14 = 0; uVar14 != uVar1; uVar14 = uVar14 + 1) {
    p_Var16 = gw[1].resize;
    __s = p_Var16 + uVar14 * 0x10c + 8;
    pcVar8 = strchr((char *)__s,9);
    if (pcVar8 == (char *)0x0) {
      p_Var16 = p_Var16 + uVar14 * 0x10c;
      sVar9 = strlen((char *)__s);
      wVar5 = (wchar_t)sVar9;
      wVar6 = wVar5;
      if ((*(int *)(p_Var16 + 4) == 1) && (wVar6 = wVar5 + L'\x04', *(int *)p_Var16 == 0)) {
        wVar6 = wVar5;
      }
      if (wVar6 < local_9c) {
        wVar6 = local_9c;
      }
    }
    else {
      for (uVar15 = 0; (pcVar8 = strchr((char *)__s,9), pcVar8 != (char *)0x0 && (uVar15 < 0x10));
          uVar15 = uVar15 + 1) {
        wVar6 = (wchar_t)((long)pcVar8 - (long)__s);
        if ((long)pcVar8 - (long)__s < (long)colwidth[uVar15]) {
          wVar6 = colwidth[uVar15];
        }
        colwidth[uVar15] = wVar6;
        __s = (_func_void_gamewin_ptr *)(pcVar8 + 1);
      }
      wVar6 = colwidth[uVar15];
      sVar9 = strlen((char *)__s);
      wVar5 = (wchar_t)sVar9;
      if (sVar9 < (ulong)(long)wVar6) {
        wVar5 = wVar6;
      }
      colwidth[uVar15] = wVar5;
      if ((wchar_t)uVar15 < (wchar_t)local_98) {
        uVar15 = local_98;
      }
      local_98 = uVar15 & 0xffffffff;
      *(int *)&gw[4].resize = (int)uVar15;
      wVar6 = local_9c;
    }
    local_9c = wVar6;
  }
  if (*(int *)((long)&gw[1].prev + 4) != 0) {
    colwidth[0] = colwidth[0] + L'\x04';
  }
  wVar6 = calc_menuwidth(colwidth,(wchar_t *)&gw[2].next,(wchar_t)local_98);
  if (local_9c < wVar6) {
    local_9c = calc_menuwidth(colwidth,(wchar_t *)&gw[2].next,*(wchar_t *)&gw[4].resize);
  }
  wVar6 = (iVar2 - iVar3) + L'\xfffffffc';
  if (local_9c < wVar6) {
    wVar6 = local_9c;
  }
  *(wchar_t *)((long)&gw[2].win + 4) = wVar6;
  *(wchar_t *)&gw[2].win = wVar6 + L'\x04';
  *(wchar_t *)((long)&gw[2].next + (long)*(int *)&gw[4].resize * 4 + 4) = wVar6 + L'\x01';
  if ((gw[1].next != (gamewin *)0x0) &&
     (iVar3 = *(int *)&gw[2].win, sVar9 = strlen((char *)gw[1].next), (ulong)(long)iVar3 < sVar9 + 4
     )) {
    *(int *)((long)&gw[2].win + 4) = (int)sVar9;
    *(int *)&gw[2].win = (int)sVar9 + 4;
  }
  return;
}

Assistant:

static void layout_menu(struct gamewin *gw)
{
    struct win_menu *mdat = (struct win_menu*)gw->extra;
    int i, col, w, x1, x2, y1, y2;
    int colwidth[MAXCOLS];
    int scrheight;
    int scrwidth;
    int singlewidth = 0;
    
    x1 = (mdat->x1 > 0) ? mdat->x1 : 0;
    y1 = (mdat->y1 > 0) ? mdat->y1 : 0;
    x2 = (mdat->x2 > 0 && mdat->x2 <= COLS) ? mdat->x2 : COLS;
    y2 = (mdat->y2 > 0 && mdat->y2 <= LINES) ? mdat->y2 : LINES;
    
    scrheight = y2 - y1;
    scrwidth = x2 - x1;
    
    /* calc height */
    mdat->frameheight = 2;
    if (mdat->title && mdat->title[0]) {
	mdat->frameheight += 2; /* window title + space */
    }
	
    mdat->height = mdat->frameheight + min(mdat->icount, 52);
    if (mdat->height > scrheight)
	mdat->height = scrheight;
    mdat->innerheight = mdat->height - mdat->frameheight;
    
    /* calc width */
    mdat->maxcol = 0;
    for (i = 0; i < MAXCOLS; i++)
	colwidth[i] = 0;
    
    for (i = 0; i < mdat->icount; i++) {
	/* headings without tabs are not fitted into columns, but headers with
	 * tabs are presumably column titles */
	if (!strchr(mdat->items[i].caption, '\t')) {
	    w = strlen(mdat->items[i].caption);
	    if (mdat->items[i].role == MI_NORMAL && mdat->items[i].id)
		w += 4;
	    singlewidth = max(singlewidth, w);
	} else {
	    col = calc_colwidths(mdat->items[i].caption, colwidth);
	    mdat->maxcol = max(mdat->maxcol, col);
	}
    }
    if (mdat->how != PICK_NONE)
	colwidth[0] += 4; /* "a - " */
    
    mdat->innerwidth = max(calc_menuwidth(colwidth, mdat->colpos, mdat->maxcol),
			   singlewidth);
    if (mdat->innerwidth > scrwidth - 4)/* make sure there is space for window borders */
	mdat->innerwidth = scrwidth - 4;
    mdat->width = mdat->innerwidth + 4; /* border + space */
    mdat->colpos[mdat->maxcol+1] = mdat->innerwidth+1;
    
    if (mdat->title && mdat->width < strlen(mdat->title) + 4) {
	mdat->innerwidth = strlen(mdat->title);
	mdat->width = mdat->innerwidth + 4;
    }
}